

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

secp256k1_bulletproof_generators *
secp256k1_bulletproof_generators_create
          (secp256k1_context *ctx,secp256k1_generator *blinding_gen,size_t n)

{
  int iVar1;
  secp256k1_ge *psVar2;
  size_t in_RDX;
  long in_RSI;
  secp256k1_generator gen;
  uchar tmp [32];
  size_t i;
  secp256k1_gej precompj;
  uchar seed [64];
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_bulletproof_generators *ret;
  secp256k1_ge *in_stack_fffffffffffffe58;
  secp256k1_gej *in_stack_fffffffffffffe60;
  secp256k1_context *in_stack_fffffffffffffe68;
  undefined1 local_168 [40];
  ulong local_140;
  size_t in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff28;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffff30;
  uchar local_b8 [32];
  uchar auStack_98 [112];
  secp256k1_bulletproof_generators *local_28;
  size_t local_20;
  secp256k1_bulletproof_generators *local_8;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
    local_8 = (secp256k1_bulletproof_generators *)0x0;
  }
  else {
    local_20 = in_RDX;
    local_28 = (secp256k1_bulletproof_generators *)
               checked_malloc((secp256k1_callback *)in_stack_fffffffffffffe60,
                              (size_t)in_stack_fffffffffffffe58);
    if (local_28 == (secp256k1_bulletproof_generators *)0x0) {
      local_8 = (secp256k1_bulletproof_generators *)0x0;
    }
    else {
      psVar2 = (secp256k1_ge *)
               checked_malloc((secp256k1_callback *)in_stack_fffffffffffffe60,
                              (size_t)in_stack_fffffffffffffe58);
      local_28->gens = psVar2;
      if (local_28->gens == (secp256k1_ge *)0x0) {
        free(local_28);
        local_8 = (secp256k1_bulletproof_generators *)0x0;
      }
      else {
        local_28->blinding_gen = local_28->gens + local_20;
        local_28->n = local_20;
        secp256k1_fe_get_b32(local_b8,&secp256k1_ge_const_g.x);
        secp256k1_fe_get_b32(auStack_98,&secp256k1_ge_const_g.y);
        secp256k1_rfc6979_hmac_sha256_initialize
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        for (local_140 = 0; local_140 < local_20; local_140 = local_140 + 1) {
          memset(local_168,0,0x20);
          secp256k1_rfc6979_hmac_sha256_generate
                    ((secp256k1_rfc6979_hmac_sha256 *)gen.data._16_8_,(uchar *)gen.data._8_8_,
                     gen.data._0_8_);
          iVar1 = secp256k1_generator_generate
                            (in_stack_fffffffffffffe68,
                             (secp256k1_generator *)in_stack_fffffffffffffe60,
                             (uchar *)in_stack_fffffffffffffe58);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tangramproject[P]secp256k1-zkp/src/modules/bulletproofs/main_impl.h"
                    ,0x3c,"test condition failed: secp256k1_generator_generate(ctx, &gen, tmp)");
            abort();
          }
          secp256k1_generator_load
                    ((secp256k1_ge *)in_stack_fffffffffffffe60,
                     (secp256k1_generator *)in_stack_fffffffffffffe58);
          secp256k1_gej_set_ge(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        }
        secp256k1_generator_load
                  ((secp256k1_ge *)in_stack_fffffffffffffe60,
                   (secp256k1_generator *)in_stack_fffffffffffffe58);
        secp256k1_gej_set_ge(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        local_8 = local_28;
      }
    }
  }
  return local_8;
}

Assistant:

secp256k1_bulletproof_generators *secp256k1_bulletproof_generators_create(const secp256k1_context *ctx, const secp256k1_generator *blinding_gen, size_t n) {
    secp256k1_bulletproof_generators *ret;
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char seed[64];
    secp256k1_gej precompj;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blinding_gen != NULL);

    ret = (secp256k1_bulletproof_generators *)checked_malloc(&ctx->error_callback, sizeof(*ret));
    if (ret == NULL) {
        return NULL;
    }
    ret->gens = (secp256k1_ge *)checked_malloc(&ctx->error_callback, (n + 1) * sizeof(*ret->gens));
    if (ret->gens == NULL) {
        free(ret);
        return NULL;
    }
    ret->blinding_gen = &ret->gens[n];
    ret->n = n;

    secp256k1_fe_get_b32(&seed[0], &secp256k1_ge_const_g.x);
    secp256k1_fe_get_b32(&seed[32], &secp256k1_ge_const_g.y);

    secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 64);
    for (i = 0; i < n; i++) {
        unsigned char tmp[32] = { 0 };
        secp256k1_generator gen;
        secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
        CHECK(secp256k1_generator_generate(ctx, &gen, tmp));
        secp256k1_generator_load(&ret->gens[i], &gen);

        secp256k1_gej_set_ge(&precompj, &ret->gens[i]);
    }

    secp256k1_generator_load(&ret->blinding_gen[0], blinding_gen);
    secp256k1_gej_set_ge(&precompj, &ret->blinding_gen[0]);

    return ret;
}